

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_P256.c
# Opt level: O1

void fsqr0(uint64_t *res,uint64_t *x)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t out0;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint64_t out0_1;
  ulong uVar17;
  uint64_t *os;
  uint64_t tmp [8];
  uint64_t local_78;
  ulong uStack_70;
  ulong local_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong local_48;
  ulong uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  bn_sqr4(&local_78,x);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_78;
  uVar7 = SUB168(auVar2 * ZEXT816(0xffffffff00000001),0);
  uVar8 = (local_78 << 0x20) + uStack_70;
  uVar1 = (ulong)CARRY8(local_78 << 0x20,uStack_70);
  uVar13 = (local_78 >> 0x20) + local_68;
  uVar9 = uVar13 + uVar1;
  uVar1 = (ulong)(CARRY8(local_78 >> 0x20,local_68) || CARRY8(uVar13,uVar1));
  uVar13 = uVar7 + uVar1;
  uVar14 = uVar13 + uStack_60;
  uVar12 = SUB168(auVar2 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar7,uVar1) +
           (ulong)CARRY8(uVar13,uStack_60);
  uVar10 = uVar8 >> 0x20;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar8;
  uVar7 = SUB168(auVar3 * ZEXT816(0xffffffff00000001),0);
  uVar8 = (uStack_70 << 0x20) + uVar9;
  uVar1 = (ulong)CARRY8(uStack_70 << 0x20,uVar9);
  uVar13 = uVar10 + uVar14;
  uVar11 = uVar13 + uVar1;
  uVar13 = (ulong)(CARRY8(uVar10,uVar14) || CARRY8(uVar13,uVar1));
  uVar10 = uVar7 + uVar13;
  uVar1 = uVar12 + local_58;
  uVar14 = uVar10 + uVar1;
  uVar10 = SUB168(auVar3 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar7,uVar13) +
           (ulong)CARRY8(uVar10,uVar1);
  uVar1 = (ulong)CARRY8(uVar12,local_58);
  uVar7 = uVar10 + uStack_50;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar7 + uVar1;
  uVar12 = uVar8 >> 0x20;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar8;
  uVar16 = (uVar9 << 0x20) + uVar11;
  uVar13 = (ulong)CARRY8(uVar9 << 0x20,uVar11);
  uVar8 = uVar12 + uVar14;
  uVar17 = uVar8 + uVar13;
  auVar2 = auVar4 * ZEXT816(0xffffffff00000001) + auVar6 +
           ZEXT116(CARRY8(uVar12,uVar14) || CARRY8(uVar8,uVar13));
  uVar14 = auVar2._0_8_;
  uVar12 = auVar2._8_8_;
  uVar1 = (ulong)(CARRY8(uVar10,uStack_50) || CARRY8(uVar7,uVar1));
  uVar8 = uVar12 + local_48;
  uVar15 = uVar8 + uVar1;
  uVar7 = uVar16 >> 0x20;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar16;
  uVar9 = SUB168(auVar5 * ZEXT816(0xffffffff00000001),0);
  uVar13 = (ulong)CARRY8(uVar11 << 0x20,uVar17);
  uVar10 = uVar7 + uVar14;
  uVar7 = (ulong)(CARRY8(uVar7,uVar14) || CARRY8(uVar10,uVar13));
  uVar14 = uVar9 + uVar7;
  uVar16 = SUB168(auVar5 * ZEXT816(0xffffffff00000001),8) + (ulong)CARRY8(uVar9,uVar7) +
           (ulong)CARRY8(uVar14,uVar15);
  uVar9 = (ulong)(CARRY8(uVar12,local_48) || CARRY8(uVar8,uVar1));
  uVar12 = uStack_40 + uVar16;
  *res = (uVar11 << 0x20) + uVar17;
  res[1] = uVar10 + uVar13;
  res[2] = uVar14 + uVar15;
  res[3] = uVar12 + uVar9;
  uVar1 = *res;
  uVar13 = res[1];
  uVar7 = res[2];
  uVar10 = (ulong)(uVar13 < 0xffffffff || uVar13 - 0xffffffff < (ulong)(uVar1 != 0xffffffffffffffff)
                  );
  uVar8 = res[3];
  uVar14 = (ulong)(uVar7 < uVar10);
  uVar9 = (ulong)(CARRY8(uStack_40,uVar16) || CARRY8(uVar12,uVar9)) -
          (ulong)(uVar8 < 0xffffffff00000001 || uVar8 + 0xffffffff < uVar14);
  uVar12 = ~uVar9;
  *res = uVar1 + 1 & uVar12 | uVar1 & uVar9;
  res[1] = (uVar13 - 0xffffffff) - (ulong)(uVar1 != 0xffffffffffffffff) & uVar12 | uVar13 & uVar9;
  res[2] = uVar7 - uVar10 & uVar12 | uVar7 & uVar9;
  res[3] = uVar12 & (uVar8 + 0xffffffff) - uVar14 | uVar9 & uVar8;
  return;
}

Assistant:

static inline void fsqr0(uint64_t *res, uint64_t *x)
{
  uint64_t tmp[8U] = { 0U };
  bn_sqr4(tmp, x);
  mont_reduction(res, tmp);
}